

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

bool __thiscall
sf::priv::RenderTextureImplFBO::create
          (RenderTextureImplFBO *this,uint width,uint height,uint textureId,
          ContextSettings *settings)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  Uint64 UVar5;
  GLenum GVar6;
  GLuint GVar7;
  TransientContextLock lock;
  GLint readFramebuffer;
  GLint drawFramebuffer;
  TransientContextLock local_39;
  GLuint local_38;
  GLuint local_34;
  
  this->m_width = width;
  this->m_height = height;
  GlResource::TransientContextLock::TransientContextLock(&local_39);
  ensureExtensionsInit();
  uVar1 = settings->antialiasingLevel;
  if (((uVar1 == 0) ||
      ((SF_GLAD_GL_EXT_framebuffer_multisample != 0 && (SF_GLAD_GL_EXT_framebuffer_blit != 0)))) &&
     ((settings->stencilBits == 0 || (SF_GLAD_GL_EXT_packed_depth_stencil != 0)))) {
    this->m_sRgb = settings->sRgbCapable;
    if (uVar1 != 0) {
      local_38 = 0;
      (*sf_glad_glGetIntegerv)(0x8d57,(GLint *)&local_38);
      if (local_38 < settings->antialiasingLevel) {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Impossible to create render texture (unsupported anti-aliasing level)",
                   0x45);
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Requested: ",0xc);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," Maximum supported: ",0x14);
        plVar4 = (long *)std::ostream::operator<<(poVar3,local_38);
        std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
        goto LAB_001cb96a;
      }
    }
    if (settings->antialiasingLevel == 0) {
      if (settings->stencilBits == 0) {
        if (settings->depthBits == 0) goto LAB_001cb8f6;
        local_38 = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1,&local_38);
        GVar7 = local_38;
        this->m_depthStencilBuffer = local_38;
        if (local_38 == 0) {
          poVar3 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,
                     "Impossible to create render texture (failed to create the attached depth buffer)"
                     ,0x50);
          std::endl<char,std::char_traits<char>>(poVar3);
        }
        else {
          (*sf_glad_glBindRenderbufferEXT)(0x8d41,local_38);
          (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x1902,width,height);
        }
      }
      else {
        local_38 = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1,&local_38);
        GVar7 = local_38;
        this->m_depthStencilBuffer = local_38;
        if (local_38 == 0) {
          poVar3 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,
                     "Impossible to create render texture (failed to create the attached depth/stencil buffer)"
                     ,0x58);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        else {
          (*sf_glad_glBindRenderbufferEXT)(0x8d41,local_38);
          (*sf_glad_glRenderbufferStorageEXT)(0x8d41,0x88f0,width,height);
          this->m_stencil = true;
        }
      }
      if (GVar7 == 0) goto LAB_001cb96a;
    }
    else {
      local_38 = 0;
      (*sf_glad_glGenRenderbuffersEXT)(1,&local_38);
      this->m_colorBuffer = local_38;
      if (local_38 == 0) {
        poVar3 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "Impossible to create render texture (failed to create the attached multisample color buffer)"
                   ,0x5c);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        goto LAB_001cb96a;
      }
      (*sf_glad_glBindRenderbufferEXT)(0x8d41,local_38);
      GVar6 = 0x1908;
      if (this->m_sRgb != false) {
        GVar6 = 0x8c43;
      }
      (*sf_glad_glRenderbufferStorageMultisampleEXT)
                (0x8d41,settings->antialiasingLevel,GVar6,width,height);
      if (settings->stencilBits == 0) {
        if (settings->depthBits != 0) {
          local_34 = 0;
          (*sf_glad_glGenRenderbuffersEXT)(1,&local_34);
          GVar7 = local_34;
          this->m_depthStencilBuffer = local_34;
          if (local_34 == 0) {
            poVar3 = err();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar3,
                       "Impossible to create render texture (failed to create the attached multisample depth buffer)"
                       ,0x5c);
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          else {
            (*sf_glad_glBindRenderbufferEXT)(0x8d41,local_34);
            (*sf_glad_glRenderbufferStorageMultisampleEXT)
                      (0x8d41,settings->antialiasingLevel,0x1902,width,height);
          }
          goto LAB_001cb8bb;
        }
      }
      else {
        local_34 = 0;
        (*sf_glad_glGenRenderbuffersEXT)(1,&local_34);
        GVar7 = local_34;
        this->m_depthStencilBuffer = local_34;
        if (local_34 == 0) {
          poVar3 = err();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,
                     "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)"
                     ,100);
          std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
        }
        else {
          (*sf_glad_glBindRenderbufferEXT)(0x8d41,local_34);
          (*sf_glad_glRenderbufferStorageMultisampleEXT)
                    (0x8d41,settings->antialiasingLevel,0x88f0,width,height);
          this->m_stencil = true;
        }
LAB_001cb8bb:
        if (GVar7 == 0) goto LAB_001cb96a;
      }
      this->m_multisample = true;
    }
LAB_001cb8f6:
    GlResource::TransientContextLock::~TransientContextLock(&local_39);
    this->m_textureId = textureId;
    UVar5 = Context::getActiveContextId();
    if (UVar5 == 0) {
      bVar2 = true;
    }
    else {
      local_38 = 0;
      local_34 = 0;
      (*sf_glad_glGetIntegerv)(0x8caa,(GLint *)&local_38);
      (*sf_glad_glGetIntegerv)(0x8ca6,(GLint *)&local_34);
      bVar2 = createFrameBuffer(this);
      if (bVar2) {
        (*sf_glad_glBindFramebufferEXT)(0x8ca8,local_38);
        (*sf_glad_glBindFramebufferEXT)(0x8ca9,local_34);
      }
    }
  }
  else {
LAB_001cb96a:
    GlResource::TransientContextLock::~TransientContextLock(&local_39);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RenderTextureImplFBO::create(unsigned int width, unsigned int height, unsigned int textureId, const ContextSettings& settings)
{
    // Store the dimensions
    m_width = width;
    m_height = height;

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        if (settings.antialiasingLevel && !(GLEXT_framebuffer_multisample && GLEXT_framebuffer_blit))
            return false;

        if (settings.stencilBits && !GLEXT_packed_depth_stencil)
            return false;

        m_sRgb = settings.sRgbCapable && GL_EXT_texture_sRGB;

#ifndef SFML_OPENGL_ES

        // Check if the requested anti-aliasing level is supported
        if (settings.antialiasingLevel)
        {
            GLint samples = 0;
            glCheck(glGetIntegerv(GLEXT_GL_MAX_SAMPLES, &samples));

            if (settings.antialiasingLevel > static_cast<unsigned int>(samples))
            {
                err() << "Impossible to create render texture (unsupported anti-aliasing level)";
                err() << " Requested: " << settings.antialiasingLevel << " Maximum supported: " << samples << std::endl;
                return false;
            }
        }

#endif


        if (!settings.antialiasingLevel)
        {
            // Create the depth/stencil buffer if requested
            if (settings.stencilBits)
            {

#ifndef SFML_OPENGL_ES

                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

#else

                err() << "Impossible to create render texture (failed to create the attached depth/stencil buffer)" << std::endl;
                return false;

#endif // SFML_OPENGL_ES

                m_stencil = true;

            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorage(GLEXT_GL_RENDERBUFFER, GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }
        }
        else
        {

#ifndef SFML_OPENGL_ES

            // Create the multisample color buffer
            GLuint color = 0;
            glCheck(GLEXT_glGenRenderbuffers(1, &color));
            m_colorBuffer = color;
            if (!m_colorBuffer)
            {
                err() << "Impossible to create render texture (failed to create the attached multisample color buffer)" << std::endl;
                return false;
            }
            glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_colorBuffer));
            glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), m_sRgb ? GL_SRGB8_ALPHA8_EXT : GL_RGBA, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

            // Create the multisample depth/stencil buffer if requested
            if (settings.stencilBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth/stencil buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH24_STENCIL8, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));

                m_stencil = true;
            }
            else if (settings.depthBits)
            {
                GLuint depthStencil = 0;
                glCheck(GLEXT_glGenRenderbuffers(1, &depthStencil));
                m_depthStencilBuffer = depthStencil;
                if (!m_depthStencilBuffer)
                {
                    err() << "Impossible to create render texture (failed to create the attached multisample depth buffer)" << std::endl;
                    return false;
                }
                glCheck(GLEXT_glBindRenderbuffer(GLEXT_GL_RENDERBUFFER, m_depthStencilBuffer));
                glCheck(GLEXT_glRenderbufferStorageMultisample(GLEXT_GL_RENDERBUFFER, static_cast<GLsizei>(settings.antialiasingLevel), GLEXT_GL_DEPTH_COMPONENT, static_cast<GLsizei>(width), static_cast<GLsizei>(height)));
            }

#else

            err() << "Impossible to create render texture (failed to create the multisample render buffers)" << std::endl;
            return false;

#endif // SFML_OPENGL_ES

            m_multisample = true;

        }
    }

    // Save our texture ID in order to be able to attach it to an FBO at any time
    m_textureId = textureId;

    // We can't create an FBO now if there is no active context
    if (!Context::getActiveContextId())
        return true;

#ifndef SFML_OPENGL_ES

    // Save the current bindings so we can restore them after we are done
    GLint readFramebuffer = 0;
    GLint drawFramebuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
    glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, static_cast<GLuint>(readFramebuffer)));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, static_cast<GLuint>(drawFramebuffer)));

        return true;
    }

#else

    // Save the current binding so we can restore them after we are done
    GLint frameBuffer = 0;

    glCheck(glGetIntegerv(GLEXT_GL_FRAMEBUFFER_BINDING, &frameBuffer));

    if (createFrameBuffer())
    {
        // Restore previously bound framebuffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, static_cast<GLuint>(frameBuffer)));

        return true;
    }

#endif

    return false;
}